

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void jacobi_ss_recur(double *p2,double *dp2,double *p1,double x,int order,double alpha,double beta,
                    double *b,double *c)

{
  double dVar1;
  double dVar2;
  double p0;
  double dStack_60;
  int i;
  double dp1;
  double dp0;
  double *c_local;
  double *b_local;
  double beta_local;
  double alpha_local;
  int order_local;
  double x_local;
  double *p1_local;
  double *dp2_local;
  double *p2_local;
  
  *p1 = 1.0;
  dStack_60 = 0.0;
  *p2 = x + (alpha - beta) / (alpha + beta + 2.0);
  *dp2 = 1.0;
  for (p0._4_4_ = 2; p0._4_4_ <= order; p0._4_4_ = p0._4_4_ + 1) {
    dVar1 = *p1;
    *p1 = *p2;
    dVar2 = *dp2;
    *p2 = (x - b[p0._4_4_ + -1]) * *p1 + -(c[p0._4_4_ + -1] * dVar1);
    *dp2 = -c[p0._4_4_ + -1] * dStack_60 + (x - b[p0._4_4_ + -1]) * dVar2 + *p1;
    dStack_60 = dVar2;
  }
  return;
}

Assistant:

void jacobi_ss_recur ( double *p2, double *dp2, double *p1, double x, int order, 
  double alpha, double beta, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SS_RECUR finds the value and derivative of a Jacobi polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 May 2006
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Output, double *P2, the value of J(ORDER)(X).
//
//    Output, double *DP2, the value of J'(ORDER)(X).
//
//    Output, double *P1, the value of J(ORDER-1)(X).
//
//    Input, double X, the point at which polynomials are evaluated.
//
//    Input, int ORDER, the order of the polynomial.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.
//
//    Input, double B[ORDER], C[ORDER], the recursion coefficients.
//
{
  double dp0;
  double dp1;
  int i;
  double p0;

  *p1 = 1.0;
  dp1 = 0.0;

  *p2 = x + ( alpha - beta ) / ( alpha + beta + 2.0 );
  *dp2 = 1.0;

  for ( i = 2; i <= order; i++ )
  {
    p0 = *p1;
    dp0 = dp1;

    *p1 = *p2;
    dp1 = *dp2;

    *p2 = ( x - b[i-1] ) *  ( *p1 ) - c[i-1] * p0;
    *dp2 = ( x - b[i-1] ) * dp1 + ( *p1 ) - c[i-1] * dp0;
  }
  return;
}